

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall randomx::Instruction::h_CBRANCH(Instruction *this,ostream *os)

{
  byte bVar1;
  ostream *poVar2;
  
  bVar1 = this->dst;
  poVar2 = std::operator<<(os,"r");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1 & 7);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->imm32);
  poVar2 = std::operator<<(poVar2,", COND ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(this->mod >> 4));
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Instruction::h_CBRANCH(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		os << "r" << dstIndex << ", " << (int32_t)getImm32() << ", COND " << (int)(getModCond()) << std::endl;
	}